

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::InputFile::InputFile
          (InputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  shared_ptr<Imf_3_4::InputFile::Data> *__args;
  element_type *peVar1;
  MultiPartInputFile *this_00;
  InputPartData *pIVar2;
  int numThreads_local;
  InputFile *local_38;
  
  Context::Context(&this->_ctxt);
  __args = &this->_data;
  local_38 = this;
  std::make_shared<Imf_3_4::InputFile::Data,Imf_3_4::Context*,int&>
            ((Context **)__args,(int *)&local_38);
  peVar1 = (__args->super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  this_00 = (MultiPartInputFile *)operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile(this_00,filename,ctxtinit,numThreads,false);
  std::
  __uniq_ptr_impl<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>::
  reset((__uniq_ptr_impl<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
         *)&peVar1->_mFile,this_00);
  pIVar2 = MultiPartInputFile::getPart
                     ((MultiPartInputFile *)
                      (((__args->
                        super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->_mFile)._M_t.
                      super___uniq_ptr_impl<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Imf_3_4::MultiPartInputFile_*,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
                      .super__Head_base<0UL,_Imf_3_4::MultiPartInputFile_*,_false>,0);
  ((this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _part = pIVar2;
  std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)&pIVar2->context);
  initialize(this);
  return;
}

Assistant:

InputFile::InputFile (
    const char* filename, const ContextInitializer& ctxtinit, int numThreads)
    : _data (std::make_shared<Data> (&_ctxt, numThreads))
{
    _data->_mFile.reset (new MultiPartInputFile (filename, ctxtinit, numThreads, false));
    _data->_part = _data->_mFile->getPart (Data::kDefaultPart);
    _ctxt = _data->_part->context;

    initialize ();
}